

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = this->field_0x140;
  if ((bVar1 & 2) == 0) {
    uVar2 = (long)(this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    if ((uVar2 < (this->m_num_args_range).m_min || (this->m_num_args_range).m_max < uVar2) &&
       ((this->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
      throw_nargs_range_validation_error(this);
    }
  }
  else {
    if (((bVar1 & 0x14) == 4) &&
       ((this->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
      throw_required_arg_not_used_error(this);
      bVar1 = this->field_0x140;
    }
    if (((~bVar1 & 0x14) == 0) &&
       ((this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      throw_required_arg_no_value_provided_error(this);
    }
  }
  if ((this->m_choices).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == true) {
    find_default_value_in_choices_or_throw(this);
    return;
  }
  return;
}

Assistant:

void validate() const {
    if (m_is_optional) {
      // TODO: check if an implicit value was programmed for this argument
      if (!m_is_used && !m_default_value.has_value() && m_is_required) {
        throw_required_arg_not_used_error();
      }
      if (m_is_used && m_is_required && m_values.empty()) {
        throw_required_arg_no_value_provided_error();
      }
    } else {
      if (!m_num_args_range.contains(m_values.size()) &&
          !m_default_value.has_value()) {
        throw_nargs_range_validation_error();
      }
    }

    if (m_choices.has_value()) {
      // Make sure the default value (if provided)
      // is in the list of choices
      find_default_value_in_choices_or_throw();
    }
  }